

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

sockaddr_in Utils::get_sockaddr(char *name,int port)

{
  int __ecode;
  invalid_argument *this;
  char *__rhs;
  uchar auVar1 [8];
  ulong uVar2;
  sockaddr_in sVar3;
  allocator local_a1;
  addrinfo *addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  addrinfo hints;
  
  addr = (addrinfo *)0x0;
  if (name == (char *)0x0) {
    auVar1[0] = '\0';
    auVar1[1] = '\0';
    auVar1[2] = '\0';
    auVar1[3] = '\0';
    auVar1[4] = '\0';
    auVar1[5] = '\0';
    auVar1[6] = '\0';
    auVar1[7] = '\0';
    uVar2 = 0;
  }
  else {
    hints.ai_flags = 0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_next = (addrinfo *)0x0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_family = 2;
    hints.ai_socktype = 1;
    hints.ai_protocol = 6;
    __ecode = getaddrinfo(name,(char *)0x0,(addrinfo *)&hints,(addrinfo **)&addr);
    if (__ecode != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_98,"getaddrinfo: ",&local_a1);
      __rhs = gai_strerror(__ecode);
      std::operator+(&local_78,&local_98,__rhs);
      std::invalid_argument::invalid_argument(this,(string *)&local_78);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    uVar2 = (ulong)*(uint *)(addr->ai_addr->sa_data + 2) << 0x20;
    auVar1 = *(uchar (*) [8])(addr->ai_addr->sa_data + 6);
    freeaddrinfo((addrinfo *)addr);
  }
  uVar2 = (ulong)(ushort)((ushort)port << 8 | (ushort)port >> 8) << 0x10 | uVar2 | 2;
  sVar3.sin_zero[0] = auVar1[0];
  sVar3.sin_zero[1] = auVar1[1];
  sVar3.sin_zero[2] = auVar1[2];
  sVar3.sin_zero[3] = auVar1[3];
  sVar3.sin_zero[4] = auVar1[4];
  sVar3.sin_zero[5] = auVar1[5];
  sVar3.sin_zero[6] = auVar1[6];
  sVar3.sin_zero[7] = auVar1[7];
  sVar3.sin_family = (short)uVar2;
  sVar3.sin_port = (short)(uVar2 >> 0x10);
  sVar3.sin_addr.s_addr = (int)(uVar2 >> 0x20);
  return sVar3;
}

Assistant:

struct sockaddr_in Utils::get_sockaddr(char* name, int port) {
    struct sockaddr_in sock_addr;
    struct addrinfo *addr = NULL;
    memset(&sock_addr, 0, sizeof(sock_addr));

    if (name != NULL) {
        struct addrinfo hints;
        prepare_hints(&hints);
        int code = getaddrinfo(name, NULL, &hints, &addr);
        if (code != 0) {
            throw std::invalid_argument(std::string("getaddrinfo: ") + gai_strerror(code));
        }
        memcpy(&sock_addr, addr->ai_addr, sizeof(struct sockaddr));
        freeaddrinfo(addr);
    } else {
        sock_addr.sin_addr.s_addr = htonl(INADDR_ANY);
    }
    sock_addr.sin_family = AF_INET;
    sock_addr.sin_port = htons(port);

    return sock_addr;
}